

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode Variant_decodeBinary(UA_Variant *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_Byte *pUVar2;
  undefined1 uVar3;
  byte bVar4;
  UA_DataTypeMember *pUVar5;
  undefined8 uVar6;
  char *pcVar7;
  ushort uVar8;
  uint uVar9;
  UA_StatusCode UVar10;
  UA_StatusCode UVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  UA_DataType *pUVar15;
  void *pvVar16;
  UA_DataType *pUVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  UA_Byte UVar21;
  UA_UInt32 *pUVar22;
  undefined2 extraout_DX;
  uint uVar23;
  UA_DataType *type;
  UA_UInt32 *pUVar24;
  UA_DataType *pUVar25;
  long lVar26;
  long lVar27;
  UA_UInt32 *pUVar28;
  UA_UInt32 UVar29;
  undefined4 uVar30;
  undefined8 in_R8;
  UA_UInt16 UVar31;
  uint uVar32;
  size_t *psVar33;
  long lVar34;
  bool bVar35;
  byte bVar36;
  undefined1 auStack_58 [16];
  UA_DataType *apUStack_48 [2];
  undefined8 local_38;
  
  bVar36 = 0;
code_r0x0011212b:
  pUVar1 = pos + 1;
  if (end < pUVar1) {
    return 0x80070000;
  }
  bVar4 = *pos;
  if (bVar4 == 0) {
    pos = pUVar1;
    return 0;
  }
  uVar23 = bVar4 & 0x3f;
  uVar13 = (ulong)uVar23 - 1;
  if (0x18 < uVar13) {
    pos = pUVar1;
    return 0x80070000;
  }
  pUVar25 = UA_TYPES + uVar13;
  pos = pUVar1;
  dst->type = pUVar25;
  pUVar1 = pos;
  if ((char)bVar4 < '\0') {
    apUStack_48[1] = (UA_DataType *)0x112203;
    UVar10 = Array_decodeBinary(&dst->data,&dst->arrayLength,pUVar25);
    if ((bVar4 & 0x40) != 0) {
      apUStack_48[1] = (UA_DataType *)0x112227;
      UVar11 = Array_decodeBinary(&dst->arrayDimensions,&dst->arrayDimensionsSize,UA_TYPES + 5);
      return UVar10 | UVar11;
    }
    return UVar10;
  }
  if (uVar13 == 0x15) {
    local_38._0_2_ = 0;
    local_38._2_2_ = 0;
    local_38._4_4_ = UA_NODEIDTYPE_NUMERIC;
    apUStack_48[1] = (UA_DataType *)0x1121bc;
    UVar10 = NodeId_decodeBinary((UA_NodeId *)&local_38,_);
    if (UVar10 != 0) {
      return UVar10;
    }
    pUVar2 = pos + 1;
    if (end < pUVar2) {
      apUStack_48[1] = (UA_DataType *)0x1121e8;
      UA_NodeId_deleteMembers((UA_NodeId *)&local_38);
      return 0x80070000;
    }
    UVar21 = *pos;
    pos = pUVar2;
    if (((UVar21 == '\x01') && (local_38._4_4_ == UA_NODEIDTYPE_NUMERIC)) &&
       ((UA_UInt16)local_38 == 0)) {
      apUStack_48[1] = (UA_DataType *)0x11228b;
      UVar10 = findDataTypeByBinary((UA_NodeId *)&local_38,&dst->type);
      if (UVar10 == 0) {
        pos = pos + 4;
        goto LAB_001122af;
      }
    }
    if (dst->type != (UA_DataType *)0x13b780) {
      apUStack_48[1] = (UA_DataType *)DiagnosticInfo_decodeBinary;
      __assert_fail("dst->type == &UA_TYPES[21]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x1ab3,"UA_StatusCode Variant_decodeBinaryUnwrapExtensionObject(UA_Variant *)")
      ;
    }
    apUStack_48[1] = (UA_DataType *)0x1122af;
    pos = pUVar1;
    UA_NodeId_deleteMembers((UA_NodeId *)&local_38);
LAB_001122af:
    pUVar25 = dst->type;
    apUStack_48[1] = (UA_DataType *)0x1122ba;
    pvVar16 = UA_new(pUVar25);
    dst->data = pvVar16;
    if (pvVar16 == (void *)0x0) {
      return 0x80030000;
    }
    if ((pUVar25->field_0x25 & 1) == 0) {
      uVar13 = 0x19;
    }
    else {
      uVar13 = (ulong)pUVar25->typeIndex;
    }
    apUStack_48[1] = (UA_DataType *)0x1122ec;
    UVar10 = (*(code *)(&decodeBinaryJumpTable)[uVar13])(pvVar16,pUVar25);
    if (UVar10 == 0) {
      return 0;
    }
    apUStack_48[1] = (UA_DataType *)0x1122fc;
    free(dst->data);
    dst->data = (void *)0x0;
    return UVar10;
  }
  apUStack_48[1] = (UA_DataType *)0x11223a;
  pUVar15 = (UA_DataType *)UA_new(pUVar25);
  dst->data = pUVar15;
  pUVar24 = (UA_UInt32 *)end;
  pUVar1 = pos;
  if (pUVar15 == (UA_DataType *)0x0) {
    return 0x80030000;
  }
  _ = pUVar25;
  dst = (UA_Variant *)pUVar15;
  switch(uVar23) {
  case 0:
    apUStack_48[0] = (UA_DataType *)(ulong)UA_TYPES[uVar13].membersSize;
    auStack_58._0_8_ = UA_TYPES;
    auStack_58._8_8_ = pUVar25 + -(ulong)UA_TYPES[uVar13].typeIndex;
    pUVar17 = (UA_DataType *)0x0;
    UVar10 = 0;
    local_38 = pUVar25;
    while ((pUVar1 = pos, pUVar17 < apUStack_48[0] && (UVar10 == 0))) {
      pUVar5 = pUVar25->members;
      type = (UA_DataType *)
             ((ulong)pUVar5[(long)pUVar17].memberTypeIndex * 0x30 +
             *(long *)(auStack_58 + (ulong)(~(uint)(byte)pUVar5[(long)pUVar17].field_0xb & 1) * 8));
      psVar33 = (size_t *)
                ((long)&((UA_Variant *)pUVar15)->type + (ulong)pUVar5[(long)pUVar17].padding);
      if ((pUVar5[(long)pUVar17].field_0xb & 2) == 0) {
        uVar13 = 0x19;
        if ((type->field_0x25 & 1) != 0) {
          uVar13 = (ulong)type->typeIndex;
        }
        apUStack_48[1] = (UA_DataType *)(ulong)type->memSize;
        UVar10 = (*(code *)(&encodeBinaryJumpTable)[uVar13])(psVar33,type);
        pUVar15 = apUStack_48[1];
        if (UVar10 == 0x80080000) {
          pos = pUVar1;
          UVar10 = exchangeBuffer();
          pUVar5 = pUVar5 + (long)pUVar17;
          pUVar17 = (UA_DataType *)((long)&pUVar17[-1].members + 7);
          pUVar15 = (UA_DataType *)-(ulong)pUVar5->padding;
        }
        pUVar15 = (UA_DataType *)((long)psVar33 + (long)pUVar15);
        pUVar25 = local_38;
      }
      else {
        UVar10 = Array_encodeBinary((void *)psVar33[1],*psVar33,type);
        pUVar15 = (UA_DataType *)(psVar33 + 2);
      }
      pUVar17 = (UA_DataType *)((long)&pUVar17->typeName + 1);
    }
    return UVar10;
  case 1:
    UVar10 = 0x80070000;
    if (pos + 1 <= end) {
      *(bool *)&pUVar15->typeName = *pos != '\0';
      UVar10 = 0;
      pos = pos + 1;
    }
    return UVar10;
  case 2:
  case 3:
    UVar10 = 0x80070000;
    if (pos + 1 <= end) {
      *(UA_Byte *)&pUVar15->typeName = *pos;
      pos = pos + 1;
      UVar10 = 0;
    }
    return UVar10;
  case 4:
  case 5:
    UVar10 = 0x80070000;
    if (pos + 2 <= end) {
      *(UA_UInt16 *)&pUVar15->typeName = *(UA_UInt16 *)pos;
      pos = pos + 2;
      UVar10 = 0;
    }
    return UVar10;
  case 6:
  case 7:
  case 10:
  case 0x13:
    UVar10 = 0x80070000;
    if (pos + 4 <= end) {
      *(undefined4 *)&pUVar15->typeName = *(undefined4 *)pos;
      pos = pos + 4;
      UVar10 = 0;
    }
    return UVar10;
  case 8:
  case 9:
  case 0xb:
  case 0xd:
    UVar10 = 0x80070000;
    if (pos + 8 <= end) {
      pUVar15->typeName = *(char **)pos;
      pos = pos + 8;
      UVar10 = 0;
    }
    return UVar10;
  case 0xc:
  case 0xf:
  case 0x10:
    UVar10 = Array_decodeBinary((void **)&pUVar15->typeId,(size_t *)pUVar15,UA_TYPES + 2);
    return UVar10;
  case 0xe:
    uVar23 = 0x80070000;
    if (end < pos + 4) {
      uVar9 = 0x80070000;
    }
    else {
      *(undefined4 *)&pUVar15->typeName = *(undefined4 *)pos;
      pos = pos + 4;
      uVar9 = 0;
    }
    if (pos + 2 <= end) {
      *(undefined2 *)((long)&pUVar15->typeName + 4) = *(undefined2 *)pos;
      pos = pos + 2;
      uVar23 = 0;
    }
    UVar10 = 0x80070000;
    if (end < pos + 2) {
      uVar32 = 0x80070000;
    }
    else {
      *(undefined2 *)((long)&pUVar15->typeName + 6) = *(undefined2 *)pos;
      pos = pos + 2;
      uVar32 = 0;
    }
    if (pos + 8 <= end) {
      UVar10 = uVar23 | uVar9 | uVar32;
      (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length =
           *(size_t *)pos;
      pos = pos + 8;
    }
    return UVar10;
  case 0x11:
    pUVar22 = (UA_UInt32 *)(pos + 1);
    if (end < pUVar22) {
      return 0x80070000;
    }
    switch(*pos) {
    case '\0':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
      if (pUVar24 < pUVar1 + 2) {
        uVar23 = 0x80070000;
        UVar29 = 0;
      }
      else {
        UVar29 = (UA_UInt32)(byte)*pUVar22;
        uVar23 = 0;
        pos = pUVar1 + 2;
      }
      ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->numeric = UVar29;
      *(UA_UInt16 *)&pUVar15->typeName = 0;
      break;
    case '\x01':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
      pUVar28 = (UA_UInt32 *)(pUVar1 + 2);
      uVar23 = 0x80070000;
      UVar29 = 0;
      if (pUVar24 < pUVar28) {
        UVar31 = 0;
        uVar9 = 0x80070000;
        pUVar28 = pUVar22;
      }
      else {
        UVar31 = (UA_UInt16)(byte)*pUVar22;
        uVar9 = 0;
        pos = (UA_Byte *)pUVar28;
      }
      *(UA_UInt16 *)&pUVar15->typeName = UVar31;
      if ((ushort *)((long)pUVar28 + 2U) <= pUVar24) {
        UVar29 = (UA_UInt32)(ushort)*pUVar28;
        uVar23 = 0;
        pos = (UA_Byte *)((long)pUVar28 + 2U);
      }
      uVar23 = uVar23 | uVar9;
      ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->numeric = UVar29;
      break;
    case '\x02':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
      uVar23 = 0x80070000;
      if (pUVar24 < pUVar1 + 3) {
        uVar9 = 0x80070000;
      }
      else {
        *(ushort *)&pUVar15->typeName = (ushort)*pUVar22;
        pUVar22 = (UA_UInt32 *)(pos + 2);
        uVar9 = 0;
        pUVar24 = (UA_UInt32 *)end;
        pos = (UA_Byte *)pUVar22;
      }
      if (pUVar22 + 1 <= pUVar24) {
        ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->numeric = *pUVar22;
        uVar23 = 0;
        pos = (UA_Byte *)(pUVar22 + 1);
      }
      uVar23 = uVar23 | uVar9;
      break;
    case '\x03':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_STRING;
      uVar9 = 0x80070000;
      if ((UA_DataType *)(pUVar1 + 3) <= pUVar24) {
        *(ushort *)&pUVar15->typeName = (ushort)*pUVar22;
        pos = pos + 2;
        uVar9 = 0;
      }
      uVar23 = String_decodeBinary(&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->
                                    string,(UA_DataType *)(pUVar1 + 3));
      goto LAB_00111c27;
    case '\x04':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_GUID;
      uVar9 = 0x80070000;
      if ((UA_DataType *)(pUVar1 + 3) <= pUVar24) {
        *(ushort *)&pUVar15->typeName = (ushort)*pUVar22;
        pos = pos + 2;
        uVar9 = 0;
      }
      uVar23 = Guid_decodeBinary(&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->
                                  guid,(UA_DataType *)(pUVar1 + 3));
      goto LAB_00111c27;
    case '\x05':
      pos = (UA_Byte *)pUVar22;
      *(UA_NodeIdType *)((long)&pUVar15->typeName + 4) = UA_NODEIDTYPE_BYTESTRING;
      uVar9 = 0x80070000;
      if (pUVar1 + 3 <= pUVar24) {
        *(ushort *)&pUVar15->typeName = (ushort)*pUVar22;
        pos = pos + 2;
        uVar9 = 0;
      }
      uVar23 = ByteString_decodeBinary
                         (&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->byteString
                         );
LAB_00111c27:
      uVar23 = uVar23 | uVar9;
      break;
    default:
      uVar23 = 0x80020000;
      pos = (UA_Byte *)pUVar22;
    }
    return uVar23;
  case 0x12:
    UVar10 = 0x80070000;
    if (pos < end) {
      bVar36 = *pos;
      *pos = bVar36 & 0x3f;
      UVar10 = NodeId_decodeBinary((UA_NodeId *)pUVar15,pUVar25);
      if ((char)bVar36 < '\0') {
        *(UA_UInt16 *)&pUVar15->typeName = 0;
        UVar11 = String_decodeBinary((UA_String *)
                                     ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId +
                                     1),pUVar25);
        UVar10 = UVar10 | UVar11;
      }
      if ((bVar36 & 0x40) != 0) {
        uVar23 = 0x80070000;
        if (pos + 4 <= end) {
          *(undefined4 *)&pUVar15->members = *(undefined4 *)pos;
          uVar23 = 0;
          pos = pos + 4;
        }
        UVar10 = UVar10 | uVar23;
      }
    }
    return UVar10;
  case 0x14:
  case 0x1a:
    bVar36 = UA_TYPES[uVar13].membersSize;
    apUStack_48[0] = UA_TYPES;
    local_38 = pUVar25;
    apUStack_48[1] = pUVar25 + -(ulong)UA_TYPES[uVar13].typeIndex;
    uVar23 = 0;
    for (lVar26 = 0; (ulong)bVar36 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
      pUVar5 = local_38->members;
      pUVar25 = apUStack_48[~(uint)(byte)(&pUVar5->field_0xb)[lVar26] & 1] +
                *(ushort *)((long)&pUVar5->memberTypeIndex + lVar26);
      psVar33 = (size_t *)((long)&((UA_Variant *)pUVar15)->type + (ulong)(&pUVar5->padding)[lVar26])
      ;
      if (((&pUVar5->field_0xb)[lVar26] & 2) == 0) {
        uVar14 = 0x19;
        if ((pUVar25->field_0x25 & 1) != 0) {
          uVar14 = (ulong)pUVar25->typeIndex;
        }
        uVar13 = (ulong)pUVar25->memSize;
        auStack_58._8_8_ = 0x111ddc;
        uVar9 = (*(code *)(&decodeBinaryJumpTable)[uVar14])(psVar33,pUVar25);
      }
      else {
        auStack_58._8_8_ = 0x111dea;
        uVar9 = Array_decodeBinary((void **)(psVar33 + 1),psVar33,pUVar25);
        auStack_58._8_8_ = 0x10;
        uVar13 = 0x10;
      }
      pUVar15 = (UA_DataType *)((long)psVar33 + uVar13);
      uVar23 = uVar23 | uVar9;
    }
    return uVar23;
  case 0x15:
    pUVar1 = pos + 1;
    UVar10 = 0x80070000;
    if (pUVar1 <= end) {
      bVar36 = *pos;
      UVar10 = 0;
      pos = pUVar1;
      if ((bVar36 & 1) != 0) {
        UVar10 = String_decodeBinary((UA_String *)pUVar15,pUVar25);
      }
      if ((bVar36 & 2) != 0) {
        UVar11 = String_decodeBinary((UA_String *)((long)&pUVar15->typeId + 8),pUVar25);
        UVar10 = UVar10 | UVar11;
      }
    }
    return UVar10;
  case 0x16:
    local_38 = (UA_DataType *)0x0;
    auStack_58._8_8_ = 0x111e92;
    UVar10 = NodeId_decodeBinary((UA_NodeId *)&local_38,pUVar25);
    uVar23 = 0;
    if (end < pos + 1) {
      UVar21 = '\0';
      uVar23 = 0x80070000;
    }
    else {
      UVar21 = *pos;
      pos = pos + 1;
    }
    pUVar1 = pos;
    UVar11 = 0x80070000;
    if (local_38._4_4_ == UA_NODEIDTYPE_NUMERIC) {
      UVar11 = uVar23 | UVar10;
    }
    if (UVar11 == 0) {
      if (UVar21 == '\0') {
        *(undefined4 *)&pUVar15->typeName = 0;
        (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length =
             (size_t)local_38;
        *(undefined8 *)((long)&pUVar15->typeId + 8) = 0;
        ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string.length = 0;
        pUVar15->memSize = 0;
        pUVar15->typeIndex = 0;
        pUVar15->membersSize = '\0';
        pUVar15->field_0x25 = 0;
        pUVar15->binaryEncodingId = 0;
        pUVar15->members = (UA_DataTypeMember *)0x0;
        UVar11 = 0;
      }
      else {
        if (UVar21 == '\x02') {
          *(undefined4 *)&pUVar15->typeName = 2;
          (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length =
               (size_t)local_38;
          *(undefined8 *)((long)&pUVar15->typeId + 8) = 0;
          ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string.length = 0;
          UVar10 = ByteString_decodeBinary((UA_ByteString *)&pUVar15->memSize);
          return UVar10;
        }
        UVar11 = 0x80070000;
        if (UVar21 == '\x01') {
          apUStack_48[1] = (UA_DataType *)0x0;
          auStack_58._8_8_ = 0x111f18;
          findDataTypeByBinary((UA_NodeId *)&local_38,apUStack_48 + 1);
          pUVar25 = apUStack_48[1];
          if (apUStack_48[1] == (UA_DataType *)0x0) {
            *(undefined4 *)&pUVar15->typeName = 1;
            (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length =
                 (size_t)local_38;
            *(undefined8 *)((long)&pUVar15->typeId + 8) = 0;
            ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string.length = 0;
            auStack_58._8_8_ = 0x111fd3;
            UVar11 = ByteString_decodeBinary((UA_ByteString *)&pUVar15->memSize);
          }
          else {
            auStack_58._8_8_ = 0x111f2c;
            pvVar16 = UA_new(apUStack_48[1]);
            *(void **)((long)&pUVar15->typeId + 8) = pvVar16;
            if (pvVar16 == (void *)0x0) {
              UVar11 = 0x80030000;
            }
            else {
              pos = pUVar1 + 4;
              *(undefined4 *)&pUVar15->typeName = 3;
              (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length =
                   (size_t)pUVar25;
              if ((pUVar25->field_0x25 & 1) == 0) {
                uVar13 = 0x19;
              }
              else {
                uVar13 = (ulong)pUVar25->typeIndex;
              }
              auStack_58._8_8_ = 0x111ff3;
              UVar11 = (*(code *)(&decodeBinaryJumpTable)[uVar13])(pvVar16,pUVar25);
            }
          }
        }
      }
    }
    else {
      auStack_58._8_8_ = 0x111edb;
      UA_NodeId_deleteMembers((UA_NodeId *)&local_38);
    }
    return UVar11;
  case 0x17:
    pUVar1 = pos + 1;
    uVar23 = 0x80070000;
    if (pUVar1 <= end) {
      bVar36 = *pos;
      uVar23 = 0;
      pos = pUVar1;
      if ((bVar36 & 1) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 1;
        uVar23 = Variant_decodeBinary
                           ((UA_Variant *)
                            &((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string,
                            pUVar25);
      }
      if ((bVar36 & 2) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 2;
        UVar10 = StatusCode_decodeBinary
                           (&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15[1].typeId)->
                             numeric);
        uVar23 = uVar23 | UVar10;
      }
      if ((bVar36 & 4) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 4;
        UVar10 = DateTime_decodeBinary
                           ((UA_DateTime *)
                            (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15[1].typeId)->guid).
                            data4);
        uVar23 = uVar23 | UVar10;
      }
      if ((bVar36 & 0x10) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 0x10;
        if (end < pos + 2) {
          uVar8 = *(ushort *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar15[1].typeId + 1);
          uVar9 = 0x80070000;
        }
        else {
          uVar8 = *(ushort *)pos;
          *(ushort *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar15[1].typeId + 1) = uVar8;
          uVar9 = 0;
          pos = pos + 2;
        }
        uVar23 = uVar9 | uVar23;
        if (9999 < uVar8) {
          *(undefined2 *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar15[1].typeId + 1) = 9999;
        }
      }
      if ((bVar36 & 8) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 8;
        UVar10 = DateTime_decodeBinary((UA_DateTime *)&pUVar15[1].memSize);
        uVar23 = uVar23 | UVar10;
      }
      if ((bVar36 & 0x20) != 0) {
        *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 0x20;
        if (end < pos + 2) {
          uVar8 = *(ushort *)&pUVar15[1].members;
          uVar9 = 0x80070000;
        }
        else {
          uVar8 = *(ushort *)pos;
          *(ushort *)&pUVar15[1].members = uVar8;
          uVar9 = 0;
          pos = pos + 2;
        }
        uVar23 = uVar9 | uVar23;
        if (9999 < uVar8) {
          *(undefined2 *)&pUVar15[1].members = 9999;
        }
      }
    }
    return uVar23;
  case 0x18:
    goto code_r0x0011212b;
  case 0x19:
    uVar9 = 0;
    local_38 = (UA_DataType *)(ulong)uVar23;
    break;
  default:
    return (UA_StatusCode)UA_TYPES[uVar13].memSize;
  case 0x26:
  case 0x29:
  case 0x2a:
    return (int)pUVar15->typeName + 4;
  case 0x28:
    return 0x10;
  case 0x2b:
    UVar10 = 0;
    switch(*(UA_NodeIdType *)((long)&pUVar15->typeName + 4)) {
    case UA_NODEIDTYPE_NUMERIC:
      UVar10 = 7;
      if ((((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->numeric < 0x10000) &&
         (*(ushort *)&pUVar15->typeName < 0x100)) {
        UVar10 = 4;
        if (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->numeric < 0x100) {
          UVar10 = (uint)(*(ushort *)&pUVar15->typeName != 0) * 2 + 2;
        }
      }
      break;
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
      UVar10 = (int)(((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length +
               7;
      break;
    case UA_NODEIDTYPE_GUID:
      UVar10 = 0x13;
    }
    return UVar10;
  case 0x2c:
    sVar18 = NodeId_calcSizeBinary((UA_NodeId *)pUVar15,pUVar25);
    UVar10 = (UA_StatusCode)sVar18;
    if (*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string != 0) {
      UVar10 = (UA_StatusCode)sVar18 + 4 +
               (int)*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].
                              string;
    }
    if (*(int *)&pUVar15->members != 0) {
      UVar10 = UVar10 + 4;
    }
    return UVar10;
  case 0x2e:
  case 0x34:
    bVar36 = UA_TYPES[uVar13].membersSize;
    apUStack_48[0] = UA_TYPES;
    local_38 = pUVar25;
    apUStack_48[1] = pUVar25 + -(ulong)UA_TYPES[uVar13].typeIndex;
    lVar34 = 0;
    for (lVar26 = 0; (ulong)bVar36 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
      pUVar5 = local_38->members;
      pUVar25 = apUStack_48[~(uint)(byte)(&pUVar5->field_0xb)[lVar26] & 1] +
                *(ushort *)((long)&pUVar5->memberTypeIndex + lVar26);
      psVar33 = (size_t *)((long)&pUVar15->typeName + (ulong)(&pUVar5->padding)[lVar26]);
      if (((&pUVar5->field_0xb)[lVar26] & 2) == 0) {
        uVar13 = 0x19;
        if ((pUVar25->field_0x25 & 1) != 0) {
          uVar13 = (ulong)pUVar25->typeIndex;
        }
        auStack_58._8_8_ = 0x11262e;
        sVar18 = (*(code *)(&calcSizeBinaryJumpTable)[uVar13])(psVar33,pUVar25);
        uVar13 = (ulong)pUVar25->memSize;
      }
      else {
        auStack_58._8_8_ = 0x112645;
        sVar18 = Array_calcSizeBinary((void *)psVar33[1],*psVar33,pUVar25);
        auStack_58._8_8_ = 0x10;
        uVar13 = 0x10;
      }
      pUVar15 = (UA_DataType *)((long)psVar33 + uVar13);
      lVar34 = lVar34 + sVar18;
    }
    return (UA_StatusCode)lVar34;
  case 0x2f:
    if ((((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length == 0) {
      UVar10 = 1;
    }
    else {
      UVar10 = (int)pUVar15->typeName + 5;
    }
    if (*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string != 0) {
      UVar10 = UVar10 + (int)*(undefined8 *)((long)&pUVar15->typeId + 8) + 4;
    }
    return UVar10;
  case 0x30:
    uVar23 = *(uint *)&pUVar15->typeName;
    if (uVar23 < 3) {
      sVar18 = NodeId_calcSizeBinary
                         ((UA_NodeId *)
                          &((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string,
                          pUVar25);
      if (uVar23 == 0) {
        UVar10 = (int)sVar18 + 1;
      }
      else {
        uVar6._0_2_ = pUVar15->memSize;
        uVar6._2_2_ = pUVar15->typeIndex;
        uVar6._4_1_ = pUVar15->membersSize;
        uVar6._5_1_ = pUVar15->field_0x25;
        uVar6._6_2_ = pUVar15->binaryEncodingId;
        UVar10 = (int)sVar18 + (int)uVar6 + 5;
      }
    }
    else {
      sVar18 = (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string).length;
      if (((sVar18 == 0) || (lVar26 = *(long *)((long)&pUVar15->typeId + 8), lVar26 == 0)) ||
         (*(int *)(sVar18 + 0xc) != 0)) {
        UVar10 = 0;
      }
      else {
        sVar19 = NodeId_calcSizeBinary((UA_NodeId *)(sVar18 + 8),pUVar25);
        if ((*(byte *)(sVar18 + 0x25) & 1) == 0) {
          uVar13 = 0x19;
        }
        else {
          uVar13 = (ulong)*(ushort *)(sVar18 + 0x22);
        }
        iVar12 = (*(code *)(&calcSizeBinaryJumpTable)[uVar13])(lVar26,sVar18);
        UVar10 = (int)sVar19 + 5 + iVar12;
      }
    }
    return UVar10;
  case 0x31:
    bVar36 = *(byte *)&pUVar15->typeName;
    if ((bVar36 & 1) == 0) {
      iVar12 = 1;
    }
    else {
      sVar18 = Variant_calcSizeBinary
                         ((UA_Variant *)
                          &((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->string,
                          pUVar25);
      iVar12 = (int)sVar18 + 1;
      bVar36 = *(byte *)&pUVar15->typeName;
    }
    return (uint)(bVar36 >> 4 & 2) +
           (uint)(bVar36 & 8) + iVar12 + (uint)(bVar36 * '\x02' & 4) +
           (uint)(bVar36 >> 3 & 2) + (uint)(bVar36 * '\x02' & 8);
  case 0x32:
    pcVar7 = pUVar15->typeName;
    if (pcVar7 == (char *)0x0) {
      return 1;
    }
    lVar26 = *(long *)((long)&pUVar15->typeId + 8);
    if ((lVar26 == 0) &&
       (1 < ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string.length)) {
      bVar36 = 0;
      uVar30 = 0;
    }
    else {
      lVar34._0_2_ = pUVar15->memSize;
      lVar34._2_2_ = pUVar15->typeIndex;
      lVar34._4_1_ = pUVar15->membersSize;
      lVar34._5_1_ = pUVar15->field_0x25;
      lVar34._6_2_ = pUVar15->binaryEncodingId;
      uVar30 = (undefined4)CONCAT71((int7)((ulong)in_R8 >> 8),lVar34 != 0);
      bVar36 = 1;
    }
    auStack_58._0_2_ = 0;
    auStack_58._2_2_ = 0;
    auStack_58._4_4_ = UA_NODEIDTYPE_NUMERIC;
    auStack_58._8_8_ = 0;
    apUStack_48[0] = (UA_DataType *)0x0;
    local_38._7_1_ = pcVar7[0x25];
    if ((pcVar7[0x25] & 1U) == 0) {
      auStack_58._0_8_ = *(undefined8 *)(pcVar7 + 8);
      auStack_58._8_8_ = *(undefined8 *)(pcVar7 + 0x10);
      apUStack_48[0] = *(UA_DataType **)(pcVar7 + 0x18);
      if (auStack_58._4_4_ != UA_NODEIDTYPE_NUMERIC) {
        return 0;
      }
      pUVar25 = (UA_DataType *)0x19;
    }
    else {
      pUVar25 = (UA_DataType *)(ulong)*(ushort *)(pcVar7 + 0x22);
    }
    local_38 = (UA_DataType *)CONCAT44(local_38._4_4_,uVar30);
    lVar34 = (ulong)bVar36 * 4 + 1;
    lVar27 = 1;
    if (bVar36 != 0) {
      lVar27 = lVar26;
    }
    lVar26 = *(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1].string;
    uVar8 = *(ushort *)(pcVar7 + 0x20);
    apUStack_48[1] = pUVar25;
    while( true ) {
      UVar10 = (UA_StatusCode)lVar34;
      bVar35 = lVar27 == 0;
      lVar27 = lVar27 + -1;
      if (bVar35) break;
      if (((ulong)local_38 & 0x100000000000000) == 0) {
        sVar18 = NodeId_calcSizeBinary((UA_NodeId *)auStack_58,pUVar25);
        lVar34 = lVar34 + sVar18 + 5;
      }
      pUVar25 = (UA_DataType *)pUVar15->typeName;
      lVar20 = (*(code *)(&calcSizeBinaryJumpTable)[(long)apUStack_48[1]])(lVar26);
      lVar34 = lVar34 + lVar20;
      lVar26 = lVar26 + (ulong)uVar8;
    }
    if ((char)local_38 != '\0') {
      sVar18._0_2_ = pUVar15->memSize;
      sVar18._2_2_ = pUVar15->typeIndex;
      sVar18._4_1_ = pUVar15->membersSize;
      sVar18._5_1_ = pUVar15->field_0x25;
      sVar18._6_2_ = pUVar15->binaryEncodingId;
      sVar18 = Array_calcSizeBinary(pUVar15->members,sVar18,UA_TYPES + 5);
      UVar10 = UVar10 + (int)sVar18;
    }
    return UVar10;
  case 0x33:
    lVar26 = 0;
    while( true ) {
      bVar36 = *(byte *)&pUVar15->typeName;
      lVar34 = (ulong)(bVar36 >> 1 & 4) +
               (ulong)(bVar36 & 4) + (ulong)(bVar36 & 1) * 4 + (ulong)(bVar36 & 2) * 2 + 1;
      if ((bVar36 & 0x10) != 0) {
        lVar34 = lVar34 + *(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)[1]
                                    .string + 4;
      }
      lVar34 = (ulong)(bVar36 >> 3 & 4) + lVar34;
      if ((bVar36 & 0x40) == 0) break;
      pUVar15 = (UA_DataType *)pUVar15[1].typeName;
      lVar26 = lVar26 + lVar34;
    }
    return (int)lVar34 + (int)lVar26;
  case 0x35:
    out(*(undefined4 *)&pUVar25->typeName,extraout_DX);
    out(*(undefined4 *)(uVar13 * 0x30 + 0x13b394 + (ulong)bVar36 * -8),extraout_DX);
    uVar3 = in(extraout_DX);
    *(undefined1 *)&pUVar15->typeName = uVar3;
    halt_baddata();
  }
LAB_00112355:
  pUVar1 = pos + 1;
  if (end < pUVar1) {
    UVar10 = 0x80070000;
LAB_0011242d:
    return UVar10 | uVar9;
  }
  bVar36 = *pos;
  UVar10 = 0;
  pos = pUVar1;
  if ((bVar36 & 1) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 1;
    apUStack_48[1] = (UA_DataType *)0x11238b;
    UVar10 = Int32_decodeBinary((UA_Int32 *)((long)&pUVar15->typeName + 4));
  }
  if ((bVar36 & 2) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 2;
    apUStack_48[1] = (UA_DataType *)0x1123a0;
    UVar11 = Int32_decodeBinary((UA_Int32 *)
                                &((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->
                                 numeric);
    UVar10 = UVar10 | UVar11;
  }
  if ((bVar36 & 4) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 4;
    apUStack_48[1] = (UA_DataType *)0x1123b5;
    UVar11 = Int32_decodeBinary((UA_Int32 *)
                                ((long)&(((anon_union_16_4_621dfe33_for_identifier *)
                                         &pUVar15->typeId)->string).length + 4));
    UVar10 = UVar10 | UVar11;
  }
  if ((bVar36 & 8) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 8;
    apUStack_48[1] = (UA_DataType *)0x1123ca;
    UVar11 = Int32_decodeBinary((UA_Int32 *)
                                (((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId)->guid
                                ).data4);
    UVar10 = UVar10 | UVar11;
  }
  if ((bVar36 & 0x10) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 0x10;
    apUStack_48[1] = (UA_DataType *)0x1123df;
    UVar11 = String_decodeBinary((UA_String *)
                                 ((anon_union_16_4_621dfe33_for_identifier *)&pUVar15->typeId + 1),
                                 pUVar25);
    UVar10 = UVar10 | UVar11;
  }
  if ((bVar36 & 0x20) != 0) {
    *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 0x20;
    apUStack_48[1] = (UA_DataType *)0x1123f4;
    UVar11 = StatusCode_decodeBinary((UA_StatusCode *)&pUVar15->members);
    UVar10 = UVar10 | UVar11;
  }
  if ((bVar36 & 0x40) == 0) goto LAB_0011242d;
  apUStack_48[1] = (UA_DataType *)0x112407;
  pUVar25 = (UA_DataType *)0x38;
  pUVar17 = (UA_DataType *)calloc(1,0x38);
  pUVar15[1].typeName = (char *)pUVar17;
  if (pUVar17 == (UA_DataType *)0x0) {
    UVar10 = 0x80030000;
    goto LAB_0011242d;
  }
  *(byte *)&pUVar15->typeName = *(byte *)&pUVar15->typeName | 0x40;
  uVar9 = uVar9 | UVar10;
  pUVar15 = pUVar17;
  goto LAB_00112355;
}

Assistant:

static UA_StatusCode
Variant_decodeBinary(UA_Variant *dst, const UA_DataType *_) {
    /* Decode the encoding byte */
    UA_Byte encodingByte;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Return early for an empty variant (was already _inited) */
    if(encodingByte == 0)
        return UA_STATUSCODE_GOOD;

    /* Does the variant contain an array? */
    const UA_Boolean isArray = (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_ARRAY) > 0;

    /* Get the datatype of the content. The type must be a builtin data type.
     * All not-builtin types are wrapped in an ExtensionObject. */
    size_t typeIndex = (size_t)((encodingByte & UA_VARIANT_ENCODINGMASKTYPE_TYPEID_MASK) - 1);
    if(typeIndex > UA_TYPES_DIAGNOSTICINFO)
        return UA_STATUSCODE_BADDECODINGERROR;
    dst->type = &UA_TYPES[typeIndex];

    /* Decode the content */
    if(isArray) {
        retval = Array_decodeBinary(&dst->data, &dst->arrayLength, dst->type);
    } else if(typeIndex != UA_TYPES_EXTENSIONOBJECT) {
        dst->data = UA_new(dst->type);
        if(!dst->data)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = decodeBinaryJumpTable[typeIndex](dst->data, dst->type);
    } else {
        retval = Variant_decodeBinaryUnwrapExtensionObject(dst);
    }

    /* Decode array dimensions */
    if(isArray && (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_DIMENSIONS) > 0)
        retval |= Array_decodeBinary((void**)&dst->arrayDimensions,
                                     &dst->arrayDimensionsSize, &UA_TYPES[UA_TYPES_INT32]);
    return retval;
}